

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer.h
# Opt level: O3

void __thiscall disruptor::RingBuffer<int,_0>::RingBuffer(RingBuffer<int,_0> *this,size_t n)

{
  runtime_error *this_00;
  
  this->index_mask_ = (int)n + -1;
  (this->events_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->events_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->events_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (n - 1 < (n ^ n - 1)) {
    std::vector<int,_std::allocator<int>_>::resize(&this->events_,n);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"RingBuffer<T, 0>\'s size must be a positive power of 2");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

RingBuffer(size_t n = kDefaultRingBufferSize) : index_mask_(n - 1) {
    if (((n == 0) || ((n & (~n + 1)) != n))) {
      throw std::runtime_error(
          "RingBuffer<T, 0>'s size must be a positive power of 2");
    }

    events_.resize(n);
  }